

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O3

bool CRCCheck(uchar *Head,uchar *Message,int MessageLength,int pos)

{
  uint uVar1;
  uchar *ucBuffer;
  unsigned_long uVar2;
  ulong uVar3;
  uchar *puVar4;
  int iVar5;
  
  uVar3 = 0xffffffffffffffff;
  if (-0x1d < MessageLength) {
    uVar3 = (long)(MessageLength + 0x1c);
  }
  ucBuffer = (uchar *)operator_new__(uVar3);
  ucBuffer[0] = 0xaa;
  ucBuffer[1] = 'D';
  ucBuffer[2] = '\x12';
  if (-0x19 < MessageLength) {
    iVar5 = MessageLength + 0x18;
    uVar3 = 0;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    do {
      puVar4 = Message + -0x19;
      if (uVar3 < 0x19) {
        puVar4 = Head;
      }
      ucBuffer[uVar3 + 3] = puVar4[uVar3];
      uVar3 = uVar3 + 1;
    } while (iVar5 + 1 != uVar3);
  }
  uVar2 = CalculateBlockCRC32((long)(MessageLength + 0x1c),ucBuffer);
  uVar1 = *(uint *)(Message + pos);
  operator_delete__(ucBuffer);
  return uVar2 == uVar1;
}

Assistant:

bool CRCCheck(unsigned char* Head, unsigned char* Message, int MessageLength, int pos)
{
    unsigned char* CRCtest = new unsigned char[MessageLength + 28];
    CRCtest[0] = 0xAA;
    CRCtest[1] = 0x44;
    CRCtest[2] = 0x12;
    for(int i = 0; i < MessageLength + 25; ++i)
    {
        if(i < 25)
            CRCtest[i + 3] = Head[i];
        else
            CRCtest[i + 3] = Message[i - 25];
    }
    unsigned long CRC_Calcu = CalculateBlockCRC32(MessageLength + 28, CRCtest);
    unsigned long CRC = U2L((Message) + pos, 4);
    delete [] CRCtest;

    if(CRC == CRC_Calcu)
        return true;
    else
        return false;
}